

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_server_auth.cc
# Opt level: O1

int main(void)

{
  _Atomic_word *p_Var1;
  pointer pcVar2;
  int iVar3;
  Builder<prometheus::Counter> *pBVar4;
  Family<prometheus::Counter> *this;
  Counter *this_00;
  int *piVar5;
  long lVar6;
  undefined1 *puVar7;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  shared_ptr<prometheus::Registry> registry;
  Exposer exposer;
  allocator_type local_179;
  undefined1 local_178 [16];
  char local_168 [32];
  Registry *local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  _Any_data local_138;
  code *local_128;
  code *local_120;
  undefined1 local_110 [112];
  undefined1 local_a0 [16];
  string local_90;
  Exposer local_70;
  
  pcVar2 = local_110 + 0x10;
  local_110._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"127.0.0.1:8080","");
  prometheus::Exposer::Exposer(&local_70,(string *)local_110,1,(CivetCallbacks *)0x0);
  if ((pointer)local_110._0_8_ != pcVar2) {
    operator_delete((void *)local_110._0_8_);
  }
  local_148 = (Registry *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<prometheus::Registry,std::allocator<prometheus::Registry>>
            (&local_140,&local_148,(allocator<prometheus::Registry> *)local_110);
  prometheus::BuildCounter();
  local_178._0_8_ = local_168;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_178,"time_running_seconds_total","");
  pBVar4 = prometheus::detail::Builder<prometheus::Counter>::Name
                     ((Builder<prometheus::Counter> *)local_110,(string *)local_178);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"How many seconds is this server running?","");
  pBVar4 = prometheus::detail::Builder<prometheus::Counter>::Help(pBVar4,&local_90);
  this = prometheus::detail::Builder<prometheus::Counter>::Register(pBVar4,local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((char *)local_178._0_8_ != local_168) {
    operator_delete((void *)local_178._0_8_);
  }
  prometheus::detail::Builder<prometheus::Counter>::~Builder
            ((Builder<prometheus::Counter> *)local_110);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[14],_const_char_(&)[4],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_110,(char (*) [14])0x12b06b,(char (*) [4])"bar");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[18],_const_char_(&)[4],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(local_110 + 0x40),(char (*) [18])"yet_another_label",(char (*) [4])"baz");
  __l._M_len = 2;
  __l._M_array = (iterator)local_110;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_178,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_90,&local_179);
  this_00 = prometheus::Family<prometheus::Counter>::Add<>(this,(Labels *)local_178);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_178);
  lVar6 = -0x80;
  puVar7 = local_a0;
  do {
    if (puVar7 != *(undefined1 **)(puVar7 + -0x10)) {
      operator_delete(*(undefined1 **)(puVar7 + -0x10));
    }
    if (puVar7 + -0x20 != *(undefined1 **)(puVar7 + -0x30)) {
      operator_delete(*(undefined1 **)(puVar7 + -0x30));
    }
    puVar7 = puVar7 + -0x40;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0);
  local_178._0_8_ = local_148;
  local_178._8_8_ = local_140._M_pi;
  if (local_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_140._M_pi)->_M_weak_count = (local_140._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_140._M_pi)->_M_weak_count = (local_140._M_pi)->_M_weak_count + 1;
    }
  }
  local_110._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"/metrics","");
  prometheus::Exposer::RegisterCollectable
            (&local_70,(weak_ptr<prometheus::Collectable> *)local_178,(string *)local_110);
  if ((pointer)local_110._0_8_ != pcVar2) {
    operator_delete((void *)local_110._0_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)(local_178._8_8_ + 0xc);
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = *(_Atomic_word *)(local_178._8_8_ + 0xc);
      *(int *)(local_178._8_8_ + 0xc) = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*(*(_func_int ***)local_178._8_8_)[3])();
    }
  }
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_120 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/sample_server_auth.cc:34:7)>
              ::_M_invoke;
  local_128 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/sample_server_auth.cc:34:7)>
              ::_M_manager;
  local_110._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"Some Auth Realm","");
  local_178._0_8_ = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"/metrics","");
  prometheus::Exposer::RegisterAuth
            (&local_70,
             (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_138,(string *)local_110,(string *)local_178);
  if ((char *)local_178._0_8_ != local_168) {
    operator_delete((void *)local_178._0_8_);
  }
  if ((pointer)local_110._0_8_ != pcVar2) {
    operator_delete((void *)local_110._0_8_);
  }
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,__destroy_functor);
  }
  do {
    local_110._0_8_ = (pointer)0x1;
    local_110._8_8_ = 0;
    do {
      iVar3 = nanosleep((timespec *)local_110,(timespec *)local_110);
      if (iVar3 != -1) break;
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
    prometheus::Counter::Increment(this_00,1.0);
  } while( true );
}

Assistant:

int main() {
  using namespace prometheus;

  // create an http server running on port 8080
  Exposer exposer{"127.0.0.1:8080", 1};

  auto registry = std::make_shared<Registry>();

  // add a new counter family to the registry (families combine values with the
  // same name, but distinct label dimensions)
  auto& counter_family = BuildCounter()
                             .Name("time_running_seconds_total")
                             .Help("How many seconds is this server running?")
                             .Register(*registry);

  // add a counter to the metric family
  auto& seconds_counter = counter_family.Add(
      {{"another_label", "bar"}, {"yet_another_label", "baz"}});

  // ask the exposer to scrape registry on incoming scrapes for "/metrics"
  exposer.RegisterCollectable(registry, "/metrics");
  exposer.RegisterAuth(
      [](const std::string& user, const std::string& password) {
        return user == "test_user" && password == "test_password";
      },
      "Some Auth Realm");

  for (;;) {
    std::this_thread::sleep_for(std::chrono::seconds(1));
    // increment the counters by one (second)
    seconds_counter.Increment(1.0);
  }
  return 0;
}